

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  uint uVar4;
  uint uVar5;
  U32 h_00;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  BYTE *pBVar9;
  U32 UVar10;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_cc;
  U32 i_2;
  U32 h_1;
  U32 i_1;
  U32 chainPackedPointer;
  U32 bucketIdx;
  U32 i;
  U32 countBeyondMinChain;
  U32 count;
  U32 chainPos;
  U32 h;
  U32 hashIdx;
  U32 tmpMinChain;
  U32 tmpChainSize;
  U32 *tmpChainTable;
  U32 *tmpHashTable;
  U32 hashLog;
  U32 chainLimit;
  U32 chainAttempts;
  U32 cacheSize;
  U32 bucketSize;
  U32 minChain;
  U32 idx;
  U32 chainSize;
  U32 *chainTable;
  U32 *hashTable;
  U32 target;
  BYTE *base;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  int local_28;
  ulong local_10;
  
  pBVar1 = (ms->window).base;
  uVar4 = (int)ip - (int)pBVar1;
  pUVar2 = ms->hashTable;
  pUVar3 = ms->chainTable;
  uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  bucketSize = ms->nextToUpdate;
  local_d0 = bucketSize;
  if (uVar5 < uVar4) {
    local_d0 = uVar4 - uVar5;
  }
  local_d4 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  if (0xff < local_d4) {
    local_d4 = 0xff;
  }
  h_00 = (ms->cParams).hashLog - 2;
  bVar7 = (byte)h_00;
  lVar8 = 1L << (bVar7 & 0x3f);
  uVar5 = 3 << (bVar7 & 0x1f);
  local_d8 = bucketSize;
  if (uVar5 < uVar4) {
    local_d8 = uVar4 - uVar5;
  }
  for (; bucketSize < uVar4; bucketSize = bucketSize + 1) {
    pBVar9 = pBVar1 + bucketSize;
    switch((ms->cParams).minMatch) {
    default:
      local_10 = ZSTD_hash4Ptr(pBVar9,h_00);
      break;
    case 5:
      local_10 = ZSTD_hash5Ptr(pBVar9,h_00);
      break;
    case 6:
      local_10 = ZSTD_hash6Ptr(pBVar9,h_00);
      break;
    case 7:
      local_10 = ZSTD_hash7Ptr(pBVar9,h_00);
      break;
    case 8:
      local_10 = ZSTD_hash8Ptr(pBVar9,h_00);
    }
    if (local_d8 <= bucketSize) {
      pUVar2[lVar8 + (ulong)(bucketSize - local_d8)] = pUVar2[local_10 & 0xffffffff];
    }
    pUVar2[local_10 & 0xffffffff] = bucketSize;
  }
  countBeyondMinChain = 0;
  chainPos = 0;
  do {
    if ((uint)(1 << (bVar7 & 0x1f)) <= chainPos) {
      chainPos = 1 << (bVar7 & 0x1f);
      while (chainPos != 0) {
        chainPos = chainPos - 1;
        UVar10 = pUVar2[chainPos];
        for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
          pUVar2[chainPos * 4 + i_2] = 0;
        }
        pUVar2[chainPos * 4 + 3] = UVar10;
      }
      for (bucketSize = ms->nextToUpdate; bucketSize < uVar4; bucketSize = bucketSize + 1) {
        pBVar9 = pBVar1 + bucketSize;
        switch((ms->cParams).minMatch) {
        default:
          sVar6 = ZSTD_hash4Ptr(pBVar9,h_00);
          local_28 = (int)sVar6;
          break;
        case 5:
          sVar6 = ZSTD_hash5Ptr(pBVar9,h_00);
          local_28 = (int)sVar6;
          break;
        case 6:
          sVar6 = ZSTD_hash6Ptr(pBVar9,h_00);
          local_28 = (int)sVar6;
          break;
        case 7:
          sVar6 = ZSTD_hash7Ptr(pBVar9,h_00);
          local_28 = (int)sVar6;
          break;
        case 8:
          sVar6 = ZSTD_hash8Ptr(pBVar9,h_00);
          local_28 = (int)sVar6;
        }
        uVar5 = local_28 * 4;
        for (local_cc = 2; local_cc != 0; local_cc = local_cc + -1) {
          pUVar2[uVar5 + local_cc] = pUVar2[(uVar5 + local_cc) - 1];
        }
        pUVar2[uVar5] = bucketSize;
      }
      ms->nextToUpdate = uVar4;
      return;
    }
    bucketIdx = 0;
    chainPackedPointer = pUVar2[chainPos];
    i = 0;
    for (; local_d8 <= chainPackedPointer && i < 3;
        chainPackedPointer = pUVar2[lVar8 + (ulong)(chainPackedPointer - local_d8)]) {
      if (chainPackedPointer < local_d0) {
        bucketIdx = bucketIdx + 1;
      }
      i = i + 1;
    }
    if (i == 3) {
      i = 0;
      while ((i < local_d4 &&
             ((local_d0 <= chainPackedPointer ||
              ((chainPackedPointer != 0 && (bucketIdx = bucketIdx + 1, bucketIdx < 4))))))) {
        UVar10 = countBeyondMinChain + 1;
        pUVar3[countBeyondMinChain] = chainPackedPointer;
        i = i + 1;
        countBeyondMinChain = UVar10;
        if (chainPackedPointer < local_d8) break;
        chainPackedPointer = pUVar2[lVar8 + (ulong)(chainPackedPointer - local_d8)];
      }
    }
    else {
      i = 0;
    }
    if (i == 0) {
      pUVar2[chainPos] = 0;
    }
    else {
      pUVar2[chainPos] = countBeyondMinChain * 0x100 + i * -0xff;
    }
    chainPos = chainPos + 1;
  } while( true );
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = ((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}